

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O1

ostream * smf::Binasc::writeBigEndianFloat(ostream *out,float value)

{
  char local_14;
  char local_13;
  char local_12;
  char local_11;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_13,1);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_12,1);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_14,1);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_11,1);
  return out;
}

Assistant:

std::ostream& Binasc::writeBigEndianFloat(std::ostream& out, float value) {
	union { char bytes[4]; float f; } data;
	data.f = value;
	out << data.bytes[3];
	out << data.bytes[2];
	out << data.bytes[1];
	out << data.bytes[0];
	return out;
}